

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

routine_t cs_impl::fiber::create(context_t *cxt,function<void_()> *f)

{
  _Manager_type p_Var1;
  Routine *this;
  long lVar2;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *this_00;
  long lVar3;
  long *plVar4;
  routine_t rVar5;
  Routine *routine;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  Routine *local_20;
  
  this = (Routine *)operator_new(0x438);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = f->_M_invoker;
  p_Var1 = (f->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(f->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(f->super__Function_base)._M_functor + 8);
    (f->super__Function_base)._M_manager = (_Manager_type)0x0;
    f->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  Routine::Routine(this,cxt,(function<void_()> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  local_20 = this;
  lVar2 = ordinator();
  lVar3 = *(long *)(lVar2 + 0x18);
  this_00 = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
            ordinator();
  if (lVar3 == lVar2 + 0x18) {
    std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::push_back
              (this_00,&local_20);
    plVar4 = (long *)ordinator();
    rVar5 = (routine_t)((ulong)(plVar4[1] - *plVar4) >> 3);
  }
  else {
    rVar5 = *(routine_t *)
             (this_00[1].
              super__Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
              ._M_impl.super__Vector_impl_data._M_start + 2);
    lVar3 = ordinator();
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::pop_front
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar3 + 0x18));
    plVar4 = (long *)ordinator();
    if (*(long *)(*plVar4 + (ulong)(rVar5 - 1) * 8) != 0) {
      __assert_fail("ordinator.routines[id - 1] == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                    ,0x137,
                    "routine_t cs_impl::fiber::create(const cs::context_t &, std::function<void ()>)"
                   );
    }
    plVar4 = (long *)ordinator();
    *(Routine **)(*plVar4 + (ulong)(rVar5 - 1) * 8) = this;
  }
  return rVar5;
}

Assistant:

routine_t create(const cs::context_t &cxt, std::function<void()> f)
		{
			Routine *routine = new Routine(cxt, std::move(f));

			if (ordinator.indexes.empty()) {
				ordinator.routines.push_back(routine);
				return ordinator.routines.size();
			}
			else {
				routine_t id = ordinator.indexes.front();
				ordinator.indexes.pop_front();
				assert(ordinator.routines[id - 1] == nullptr);
				ordinator.routines[id - 1] = routine;
				return id;
			}
		}